

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_SevenPairs_TestShell::~TEST_MinipointCounterTest_SevenPairs_TestShell
          (TEST_MinipointCounterTest_SevenPairs_TestShell *this)

{
  TEST_MinipointCounterTest_SevenPairs_TestShell *mem;
  TEST_MinipointCounterTest_SevenPairs_TestShell *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_SevenPairs_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, SevenPairs)
{
	addPair(Tile::EastWind);
	addPair(Tile::NorthWind);
	addPair(Tile::ThreeOfCharacters);
	addPair(Tile::NineOfCircles);
	addPair(Tile::OneOfBamboos);
	addPair(Tile::GreenDragon);
	addPair(Tile::OneOfCharacters);
	s.selfDrawn();

	CHECK_EQUAL(25, m.total(false));
	CHECK_EQUAL(25, m.total());
}